

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_avappendf(cargo_astr_t *str,char *format,__va_list_tag *ap)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  va_list apc;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  if (str == (cargo_astr_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x153,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)"
                 );
  }
  if (str->s != (char **)0x0) {
    if (*str->s == (char *)0x0) {
      sVar3 = str->l;
      if (sVar3 == 0) {
        str->l = 0x100;
        sVar3 = 0x100;
      }
      str->offset = 0;
      pcVar2 = (char *)_cargo_calloc(1,sVar3);
      *str->s = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
    }
    while( true ) {
      local_38 = ap->reg_save_area;
      local_48._0_4_ = ap->gp_offset;
      local_48._4_4_ = ap->fp_offset;
      pvStack_40 = ap->overflow_arg_area;
      sVar3 = str->l;
      uVar1 = 0;
      sVar4 = sVar3 - str->offset;
      str->diff = sVar4;
      if (sVar4 != 0) {
        pcVar2 = *str->s;
        uVar1 = vsnprintf(pcVar2 + str->offset,sVar4,format,&local_48);
        pcVar2[sVar3 - 1] = '\0';
        if ((int)uVar1 < 0) {
          return -1;
        }
      }
      if ((ulong)uVar1 < str->diff) break;
      sVar4 = str->l * 2;
      if (str->l == 0) {
        sVar4 = 0x200;
      }
      str->l = sVar4;
      if (replaced_cargo_realloc == (cargo_realloc_f)0x0) {
        pcVar2 = (char *)realloc(*str->s,sVar4);
      }
      else {
        pcVar2 = (char *)(*replaced_cargo_realloc)(*str->s,sVar4);
      }
      *str->s = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
    }
    str->offset = str->offset + (ulong)uVar1;
    return uVar1;
  }
  __assert_fail("str->s",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x154,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)");
}

Assistant:

int cargo_avappendf(cargo_astr_t *str, const char *format, va_list ap)
{
    int ret = 0;
    va_list apc;
    assert(str);
    assert(str->s);

    if (!(*str->s))
    {
        if (str->l == 0)
        {
            str->l = CARGO_ASTR_DEFAULT_SIZE;
        }

        str->offset = 0;

        if (!(*str->s = _cargo_calloc(1, str->l)))
        {
            CARGODBG(1, "Out of memory!\n");
            return -1;
        }
    }

    while (1)
    {
        // We must copy the va_list otherwise it will be
        // out of sync on a realloc.
        va_copy(apc, ap);

        str->diff = (str->l - str->offset);

        if ((ret = cargo_vsnprintf(&(*str->s)[str->offset],
                str->diff, format, apc)) < 0)
        {
            CARGODBG(1, "Formatting error\n");
            return -1;
        }

        va_end(apc);

        if ((size_t)ret >= str->diff)
        {
            if (str->l == 0) str->l = CARGO_ASTR_DEFAULT_SIZE;
            str->l *= 2;
            CARGODBG(4, "Realloc %lu\n", str->l);

            if (!(*str->s = _cargo_realloc(*str->s, str->l)))
            {
                CARGODBG(1, "Out of memory!\n");
                return -1;
            }

            continue;
        }

        break;
    }

    str->offset += ret;

    return ret;
}